

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iniparser.c
# Opt level: O3

void iniparser_dumpsection_ini(dictionary *d,char *s,FILE *f)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  long lVar5;
  ssize_t sVar6;
  char keym [1025];
  char local_438 [1032];
  
  if (f != (FILE *)0x0 && d != (dictionary *)0x0) {
    pcVar2 = iniparser_getstring(d,s,(char *)0xffffffffffffffff);
    if (pcVar2 != (char *)0xffffffffffffffff) {
      sVar3 = strlen(s);
      fprintf((FILE *)f,"\n[%s]\n",s);
      sprintf(local_438,"%s:",s);
      sVar6 = d->size;
      if (0 < sVar6) {
        lVar5 = 0;
        do {
          pcVar2 = d->key[lVar5];
          if (pcVar2 != (char *)0x0) {
            iVar1 = strncmp(pcVar2,local_438,(long)((int)sVar3 + 1));
            if (iVar1 == 0) {
              pcVar4 = d->val[lVar5];
              if (pcVar4 == (char *)0x0) {
                pcVar4 = "";
              }
              fprintf((FILE *)f,"%-30s = %s\n",pcVar2 + (long)(int)sVar3 + 1,pcVar4);
              sVar6 = d->size;
            }
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < sVar6);
      }
      fputc(10,(FILE *)f);
      return;
    }
  }
  return;
}

Assistant:

void iniparser_dumpsection_ini(const dictionary * d, const char * s, FILE * f)
{
    int     j ;
    char    keym[ASCIILINESZ + 1];
    int     seclen ;

    if (d == NULL || f == NULL) return ;
    if (! iniparser_find_entry(d, s)) return ;

    seclen  = (int)strlen(s);
    fprintf(f, "\n[%s]\n", s);
    sprintf(keym, "%s:", s);
    for (j = 0 ; j < d->size ; j++) {
        if (d->key[j] == NULL)
            continue ;
        if (!strncmp(d->key[j], keym, seclen + 1)) {
            fprintf(f,
                    "%-30s = %s\n",
                    d->key[j] + seclen + 1,
                    d->val[j] ? d->val[j] : "");
        }
    }
    fprintf(f, "\n");
    return ;
}